

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O3

void __thiscall rsg::BlockStatement::BlockStatement(BlockStatement *this,GeneratorState *state)

{
  int iVar1;
  deUint32 dVar2;
  
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__BlockStatement_0018b950;
  VariableScope::VariableScope(&this->m_scope);
  (this->m_children).super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_children).super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_children).super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = state->m_shaderParams->maxStatementsPerBlock;
  dVar2 = deRandom_getUint32(&state->m_random->m_rnd);
  this->m_numChildrenToCreate = dVar2 % (iVar1 + 1U);
  VariableManager::pushVariableScope(state->m_varManager,&this->m_scope);
  return;
}

Assistant:

BlockStatement::BlockStatement (GeneratorState& state)
{
	init(state);
}